

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::ZConstraintForceModifier::doHarmonic(ZConstraintForceModifier *this)

{
  Molecule *pMVar1;
  StuntDouble *pSVar2;
  pointer ppSVar3;
  RealType RVar4;
  uint i;
  _List_node_base *p_Var5;
  long lVar6;
  pointer ppSVar7;
  uint i_1;
  long lVar8;
  _List_node_base *p_Var9;
  uint i_2;
  pointer ppMVar10;
  Vector<double,_3U> result;
  Vector3d com;
  double local_108;
  double local_100;
  double local_f8 [3];
  RealType local_e0;
  double local_d8;
  double local_d0;
  double local_c8 [4];
  undefined1 local_a8 [16];
  Vector3d local_98;
  double local_78;
  undefined8 uStack_70;
  double local_68 [2];
  _List_node_base *local_58;
  Vector3d local_48;
  
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  local_e0 = Snapshot::getPotentialEnergy(this->currSnapshot_);
  Snapshot::setRawPotential(this->currSnapshot_,local_e0);
  p_Var9 = (this->movingZMols_).
           super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var9 == (_List_node_base *)&this->movingZMols_) {
    local_108 = 0.0;
    local_100 = 0.0;
  }
  else {
    local_100 = 0.0;
    local_108 = 0.0;
    do {
      pMVar1 = (Molecule *)p_Var9[1]._M_next;
      Molecule::getCom(&local_48,pMVar1);
      p_Var5 = (_List_node_base *)&p_Var9[1]._M_prev;
      if (this->usingSMD_ != false) {
        p_Var5 = p_Var9 + 4;
      }
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_58 = p_Var5->_M_next;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar6 = 0;
      do {
        local_c8[lVar6] = local_48.super_Vector<double,_3U>.data_[lVar6] - local_68[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_98.super_Vector<double,_3U>.data_[2] = local_c8[2];
      local_98.super_Vector<double,_3U>.data_[0] = local_c8[0];
      local_98.super_Vector<double,_3U>.data_[1] = local_c8[1];
      Snapshot::wrapVector(this->currSnapshot_,&local_98);
      local_78 = (double)p_Var9[2]._M_next * 0.5;
      uStack_70 = 0;
      local_d8 = local_98.super_Vector<double,_3U>.data_[2];
      local_a8._8_4_ = DAT_0028f1d0._8_4_;
      local_a8._0_8_ =
           (double)((ulong)p_Var9[2]._M_next ^ (ulong)DAT_0028f1d0) *
           local_98.super_Vector<double,_3U>.data_[2];
      local_a8._12_4_ = DAT_0028f1d0._12_4_;
      for (ppSVar7 = (pMVar1->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar7 !=
           (pMVar1->integrableObjects_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish && (pSVar2 = *ppSVar7, pSVar2 != (StuntDouble *)0x0));
          ppSVar7 = ppSVar7 + 1) {
        local_d0 = pSVar2->mass_ * (double)local_a8._0_8_;
        RVar4 = Molecule::getMass(pMVar1);
        local_f8[2] = local_d0 / RVar4;
        lVar6 = (long)pSVar2->localIndex_ * 0x18 +
                *(long *)((long)&(pSVar2->snapshotMan_->currentSnapshot_->atomData).force.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar2->storage_);
        lVar8 = 0;
        do {
          *(double *)(lVar6 + lVar8 * 8) = local_f8[lVar8] + *(double *)(lVar6 + lVar8 * 8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
      local_108 = local_108 + local_78 * local_d8 * local_d8;
      local_100 = local_100 + (double)local_a8._0_8_;
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)&this->movingZMols_);
  }
  RVar4 = Snapshot::getRestraintPotential(this->currSnapshot_);
  Snapshot::setRestraintPotential(this->currSnapshot_,RVar4 + local_108);
  Snapshot::setPotentialEnergy(this->currSnapshot_,local_e0 + local_108);
  for (ppMVar10 = (this->unzconsMols_).
                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppMVar10 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar10 = ppMVar10 + 1) {
    pMVar1 = *ppMVar10;
    RVar4 = Molecule::getMass(pMVar1);
    local_f8[2] = (RVar4 * local_100) / this->totMassUnconsMols_;
    ppSVar3 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar7 = (pMVar1->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        (ppSVar7 != ppSVar3 && (pSVar2 = *ppSVar7, pSVar2 != (StuntDouble *)0x0));
        ppSVar7 = ppSVar7 + 1) {
      lVar6 = (long)pSVar2->localIndex_ * 0x18 +
              *(long *)((long)&(pSVar2->snapshotMan_->currentSnapshot_->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar2->storage_);
      lVar8 = 0;
      do {
        *(double *)(lVar6 + lVar8 * 8) = local_f8[lVar8] + *(double *)(lVar6 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doHarmonic() {
    RealType totalFZ(0.0);
    Vector3d force(0.0);
    Vector3d com;
    RealType restPot(0.0);
    std::list<ZconstraintMol>::iterator i;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;
    Molecule* mol;

    RealType pe = currSnapshot_->getPotentialEnergy();
    currSnapshot_->setRawPotential(pe);

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol             = i->mol;
      Vector3d com    = mol->getCom();
      RealType resPos = usingSMD_ ? i->cantPos : i->param.zTargetPos;
      Vector3d d      = com - Vector3d(0.0, 0.0, resPos);
      currSnapshot_->wrapVector(d);

      RealType diff = d[whichDirection];

      restPot += 0.5 * i->param.kz * diff * diff;

      RealType harmonicF = -(i->param.kz * diff);
      totalFZ += harmonicF;

      // adjust force
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        force[whichDirection] = getHFOfFixedZMols(mol, sd, harmonicF);
        sd->addFrc(force);
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType rp = currSnapshot_->getRestraintPotential();
    currSnapshot_->setRestraintPotential(rp + restPot);

    currSnapshot_->setPotentialEnergy(pe + restPot);

    // modify the forces of unconstrained molecules
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol                   = *j;
      force[whichDirection] = getHFOfUnconsMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }